

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O2

string * __thiscall
tinyusdz::Stage::ExportToString_abi_cxx11_
          (string *__return_storage_ptr__,Stage *this,bool relative_path)

{
  _Rb_tree_header *p_Var1;
  pointer pTVar2;
  iterator iVar3;
  uint32_t in_ECX;
  pointer pPVar4;
  size_t i;
  ulong uVar5;
  pointer pPVar6;
  size_t i_1;
  long lVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
  primNameTable;
  token nameTok;
  string local_360;
  stringstream ss;
  ostream local_330 [376];
  stringstream meta_ss;
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  ::std::operator<<(local_330,"#usda 1.0\n");
  ::std::__cxx11::stringstream::stringstream((stringstream *)&meta_ss);
  print_layer_metas_abi_cxx11_
            ((string *)&primNameTable,(tinyusdz *)&this->stage_metas,(LayerMetas *)0x1,in_ECX);
  ::std::operator<<(local_1a8,(string *)&primNameTable);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::stringbuf::str();
  lVar7 = CONCAT44(primNameTable._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                   primNameTable._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
  ::std::__cxx11::string::_M_dispose();
  if (lVar7 != 0) {
    ::std::operator<<(local_330,"(\n");
    ::std::__cxx11::stringbuf::str();
    ::std::operator<<(local_330,(string *)&primNameTable);
    ::std::__cxx11::string::_M_dispose();
    ::std::operator<<(local_330,")\n");
  }
  ::std::operator<<(local_330,"\n");
  pPVar6 = (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar4 = (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)(this->stage_metas).primChildren.
            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->stage_metas).primChildren.
            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
            super__Vector_impl_data._M_start >> 5 == ((long)pPVar4 - (long)pPVar6) / 0x350) {
    primNameTable._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &primNameTable._M_t._M_impl.super__Rb_tree_header._M_header;
    primNameTable._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    primNameTable._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar7 = 0;
    primNameTable._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         primNameTable._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (uVar5 = 0; uVar5 < (ulong)(((long)pPVar4 - (long)pPVar6) / 0x350); uVar5 = uVar5 + 1) {
      nameTok.str_._M_dataplus._M_p = (pointer)((long)&(pPVar6->_abs_path)._prim_part + lVar7);
      ::std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::Prim_const*>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                  *)&primNameTable,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(pPVar6->_elementPath)._prim_part + lVar7),(Prim **)&nameTok);
      pPVar6 = (this->_root_nodes).
               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
               super__Vector_impl_data._M_start;
      pPVar4 = (this->_root_nodes).
               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar7 = lVar7 + 0x350;
    }
    lVar7 = 0;
    for (uVar5 = 0;
        pTVar2 = (this->stage_metas).primChildren.
                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                 super__Vector_impl_data._M_start,
        uVar5 < (ulong)((long)(this->stage_metas).primChildren.
                              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 5);
        uVar5 = uVar5 + 1) {
      ::std::__cxx11::string::string
                ((string *)&nameTok.str_,(string *)((long)&(pTVar2->str_)._M_dataplus._M_p + lVar7))
      ;
      iVar3 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
              ::find(&primNameTable._M_t,&nameTok.str_);
      p_Var1 = &primNameTable._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
        tinyusdz::prim::print_prim_abi_cxx11_
                  (&local_360,*(prim **)(iVar3._M_node + 2),(Prim *)0x0,(uint32_t)p_Var1);
        ::std::operator<<(local_330,(string *)&local_360);
        ::std::__cxx11::string::_M_dispose();
        if (uVar5 != ((long)(this->stage_metas).primChildren.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->stage_metas).primChildren.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
          ::std::operator<<(local_330,"\n");
        }
      }
      ::std::__cxx11::string::_M_dispose();
      lVar7 = lVar7 + 0x20;
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
    ::~_Rb_tree(&primNameTable._M_t);
  }
  else {
    lVar7 = 0;
    for (uVar5 = 0; uVar5 < (ulong)(((long)pPVar4 - (long)pPVar6) / 0x350); uVar5 = uVar5 + 1) {
      tinyusdz::prim::print_prim_abi_cxx11_
                ((string *)&primNameTable,(prim *)((long)&(pPVar6->_abs_path)._prim_part + lVar7),
                 (Prim *)0x0,(uint32_t)((long)pPVar4 - (long)pPVar6));
      ::std::operator<<(local_330,(string *)&primNameTable);
      ::std::__cxx11::string::_M_dispose();
      pPVar6 = (this->_root_nodes).
               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
               super__Vector_impl_data._M_start;
      pPVar4 = (this->_root_nodes).
               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (uVar5 != ((long)pPVar4 - (long)pPVar6) / 0x350 - 1U) {
        ::std::operator<<(local_330,"\n");
        pPVar6 = (this->_root_nodes).
                 super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pPVar4 = (this->_root_nodes).
                 super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      lVar7 = lVar7 + 0x350;
    }
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&meta_ss);
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string Stage::ExportToString(bool relative_path) const {
  (void)relative_path; // TODO

  std::stringstream ss;

  ss << "#usda 1.0\n";

  std::stringstream meta_ss;
  meta_ss << print_layer_metas(stage_metas, /* indent */1);
  if (meta_ss.str().size()) {
    ss << "(\n";
    ss << meta_ss.str();
    ss << ")\n";
  }

  ss << "\n";

  if (stage_metas.primChildren.size() == _root_nodes.size()) {
    std::map<std::string, const Prim *> primNameTable;
    for (size_t i = 0; i < _root_nodes.size(); i++) {
      primNameTable.emplace(_root_nodes[i].element_name(), &_root_nodes[i]);
    }

    for (size_t i = 0; i < stage_metas.primChildren.size(); i++) {
      value::token nameTok = stage_metas.primChildren[i];
      DCOUT(fmt::format("primChildren  {}/{} = {}", i,
                        stage_metas.primChildren.size(), nameTok.str()));
      const auto it = primNameTable.find(nameTok.str());
      if (it != primNameTable.end()) {
        //PrimPrintRec(ss, *(it->second), 0);
        ss << prim::print_prim(*(it->second), 0);
        if (i != (stage_metas.primChildren.size() - 1)) {
          ss << "\n";
        }
      } else {
        // TODO: Report warning?
      }
    }
  } else {
    for (size_t i = 0; i < _root_nodes.size(); i++) {
      //PrimPrintRec(ss, _root_nodes[i], 0);
      ss << prim::print_prim(_root_nodes[i], 0);

      if (i != (_root_nodes.size() - 1)) {
        ss << "\n";
      }
    }
  }

  return ss.str();
}